

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::UploadTex2DCase::iterate(UploadTex2DCase *this)

{
  glBindTextureFunc p_Var1;
  glBindRenderbufferFunc p_Var2;
  glBindFramebufferFunc p_Var3;
  glFramebufferRenderbufferFunc p_Var4;
  int iVar5;
  deUint32 dVar6;
  GLenum err;
  RenderContext *context;
  undefined4 extraout_var;
  TestLog *log;
  char *description;
  ConstPixelBufferAccess local_208;
  ConstPixelBufferAccess local_1e0;
  undefined1 local_1b1;
  undefined1 local_1b0 [7];
  bool compareOk;
  ConstPixelBufferAccess local_188;
  PixelBufferAccess local_160;
  PixelBufferAccess local_138;
  TextureFormat local_110;
  undefined1 local_108 [8];
  TextureLevel stencilOnlyLevel;
  undefined1 local_d8 [8];
  TextureLevel readLevel;
  undefined1 local_a8 [8];
  TextureLevel uploadLevel;
  Texture depthStencilTex;
  undefined1 local_58 [8];
  Renderbuffer colorBuf;
  Framebuffer fbo;
  int height;
  int width;
  Functions *gl;
  RenderContext *renderCtx;
  UploadTex2DCase *this_local;
  Functions *gl_00;
  
  context = Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*context->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar5);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&colorBuf.super_ObjectWrapper.m_object,
             context);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)local_58,context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&uploadLevel.m_data.m_cap,context);
  readLevel.m_data.m_cap = (size_t)glu::mapGLInternalFormat(this->m_format);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)local_a8,(TextureFormat *)&readLevel.m_data.m_cap,0x81,0x71,1);
  tcu::TextureFormat::TextureFormat
            ((TextureFormat *)&stencilOnlyLevel.m_data.m_cap,RGBA,UNSIGNED_INT32);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)local_d8,(TextureFormat *)&stencilOnlyLevel.m_data.m_cap,0x81,0x71,1);
  tcu::TextureFormat::TextureFormat(&local_110,S,UNSIGNED_INT8);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_108,&local_110,0x81,0x71,1);
  checkDepthStencilFormatSupport((this->super_TestCase).m_context,this->m_format);
  tcu::PixelBufferAccess::PixelBufferAccess(&local_138,(TextureLevel *)local_a8);
  renderTestPatternReference(&local_138);
  tcu::PixelBufferAccess::PixelBufferAccess(&local_160,(TextureLevel *)local_108);
  renderTestPatternReference(&local_160);
  p_Var1 = gl_00->bindTexture;
  dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)&uploadLevel.m_data.m_cap);
  (*p_Var1)(0xde1,dVar6);
  (*gl_00->texStorage2D)(0xde1,1,this->m_format,0x81,0x71);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_188,(TextureLevel *)local_a8);
  glu::texSubImage2D(context,0xde1,0,0,0,&local_188);
  err = (*gl_00->getError)();
  glu::checkError(err,"Uploading texture data failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x220);
  p_Var2 = gl_00->bindRenderbuffer;
  dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_58);
  (*p_Var2)(0x8d41,dVar6);
  (*gl_00->renderbufferStorage)(0x8d41,0x8236,0x81,0x71);
  p_Var3 = gl_00->bindFramebuffer;
  dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)&colorBuf.super_ObjectWrapper.m_object);
  (*p_Var3)(0x8d40,dVar6);
  p_Var4 = gl_00->framebufferRenderbuffer;
  dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_58);
  (*p_Var4)(0x8d40,0x8ce0,0x8d41,dVar6);
  checkFramebufferStatus(gl_00);
  dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)&uploadLevel.m_data.m_cap);
  blitStencilToColor2D(context,dVar6,0x81,0x71);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_1b0,(TextureLevel *)local_d8)
  ;
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_1e0,(TextureLevel *)local_108);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_208,(TextureLevel *)local_d8);
  local_1b1 = compareStencilToRed(log,&local_1e0,&local_208);
  description = "Image comparison failed";
  if ((bool)local_1b1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~local_1b1 & QP_TEST_RESULT_FAIL,description);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_108);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_d8);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_a8);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&uploadLevel.m_data.m_cap);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)local_58);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&colorBuf.super_ObjectWrapper.m_object);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx			= m_context.getRenderContext();
		const glw::Functions&		gl					= renderCtx.getFunctions();
		const int					width				= 129;
		const int					height				= 113;
		glu::Framebuffer			fbo					(renderCtx);
		glu::Renderbuffer			colorBuf			(renderCtx);
		glu::Texture				depthStencilTex		(renderCtx);
		TextureLevel				uploadLevel			(glu::mapGLInternalFormat(m_format), width, height);
		TextureLevel				readLevel			(TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT32), width, height);
		TextureLevel				stencilOnlyLevel	(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8), width, height);

		checkDepthStencilFormatSupport(m_context, m_format);

		renderTestPatternReference(uploadLevel);
		renderTestPatternReference(stencilOnlyLevel);

		gl.bindTexture(GL_TEXTURE_2D, *depthStencilTex);
		gl.texStorage2D(GL_TEXTURE_2D, 1, m_format, width, height);
		glu::texSubImage2D(renderCtx, GL_TEXTURE_2D, 0, 0, 0, uploadLevel);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading texture data failed");

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32UI, width, height);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		checkFramebufferStatus(gl);

		blitStencilToColor2D(renderCtx, *depthStencilTex, width, height);
		glu::readPixels(renderCtx, 0, 0, readLevel);

		{
			const bool compareOk = compareStencilToRed(m_testCtx.getLog(), stencilOnlyLevel, readLevel);
			m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
									compareOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}